

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDirectSolverLS.cpp
# Opt level: O2

void __thiscall chrono::ChSolverSparseQR::PrintErrorMessage(ChSolverSparseQR *this)

{
  ComputationInfo CVar1;
  ChLog *this_00;
  char *str;
  
  CVar1 = Eigen::SparseQR<Eigen::SparseMatrix<double,_1,_int>,_Eigen::COLAMDOrdering<int>_>::info
                    (&this->m_engine);
  if (CVar1 == Success) {
    str = "computation was successful\n";
  }
  else if (CVar1 == InvalidInput) {
    str = "inputs are invalid, or the algorithm has been improperly called\n";
  }
  else {
    if (CVar1 != NumericalIssue) {
      return;
    }
    str = "QR factorization reported a problem\n";
  }
  this_00 = GetLog();
  ChStreamOutAscii::operator<<(&this_00->super_ChStreamOutAscii,str);
  return;
}

Assistant:

void ChSolverSparseQR::PrintErrorMessage() {
    // There are only three possible return codes (see Eigen SparseLU.h)
    switch (m_engine.info()) {
        case Eigen::Success:
            GetLog() << "computation was successful\n";
            break;
        case Eigen::NumericalIssue:
            GetLog() << "QR factorization reported a problem\n";
            break;
        case Eigen::InvalidInput:
            GetLog() << "inputs are invalid, or the algorithm has been improperly called\n";
            break;
        default:
            break;
    }
}